

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::initViewItemOption(QListView *this,QStyleOptionViewItem *option)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  Position PVar7;
  QStyle *pQVar8;
  
  lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QAbstractItemView::initViewItemOption((QAbstractItemView *)this,option);
  if ((*(int *)(lVar4 + 0x42c) < 0) || (*(int *)(lVar4 + 0x430) < 0)) {
    iVar3 = *(int *)(lVar4 + 0x568);
    pQVar8 = QWidget::style((QWidget *)this);
    uVar6 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x3d - (uint)(iVar3 == 0),0,this);
    option->decorationSize = (QSize)((ulong)uVar6 * 0x100000001);
  }
  PVar7 = Left;
  if (*(int *)(lVar4 + 0x568) == 1) {
    option->showDecorationSelected = false;
    (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x84;
    PVar7 = Top;
  }
  option->decorationPosition = PVar7;
  uVar5 = *(ulong *)(lVar4 + 0x550);
  if ((uVar5 & 0x8000000080000000) == 0) {
    uVar1 = (option->super_QStyleOption).rect.x1;
    uVar2 = (option->super_QStyleOption).rect.y1;
    (option->super_QStyleOption).rect.x2 = (Representation)(uVar1 + -1 + (int)uVar5);
    (option->super_QStyleOption).rect.y2 = (Representation)(uVar2 + -1 + (int)(uVar5 >> 0x20));
  }
  return;
}

Assistant:

void QListView::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_D(const QListView);
    QAbstractItemView::initViewItemOption(option);
    if (!d->iconSize.isValid()) { // otherwise it was already set in abstractitemview
        int pm = (d->viewMode == QListView::ListMode
                  ? style()->pixelMetric(QStyle::PM_ListViewIconSize, nullptr, this)
                  : style()->pixelMetric(QStyle::PM_IconViewIconSize, nullptr, this));
        option->decorationSize = QSize(pm, pm);
    }
    if (d->viewMode == QListView::IconMode) {
        option->showDecorationSelected = false;
        option->decorationPosition = QStyleOptionViewItem::Top;
        option->displayAlignment = Qt::AlignCenter;
    } else {
        option->decorationPosition = QStyleOptionViewItem::Left;
    }

    if (d->gridSize().isValid()) {
        option->rect.setSize(d->gridSize());
    }
}